

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O2

string * mg::string::bytes_to_hex(string *__return_storage_ptr__,string *bytes)

{
  size_type i;
  ulong uVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  for (uVar1 = 0; uVar1 < bytes->_M_string_length; uVar1 = uVar1 + 1) {
    bVar2 = (bytes->_M_dataplus)._M_p[uVar1];
    cVar4 = (bVar2 >> 4) + 0x37;
    if (bVar2 < 0xa0) {
      cVar4 = (bVar2 >> 4) + 0x30;
    }
    bVar2 = bVar2 & 0xf;
    cVar3 = bVar2 + 0x37;
    if (bVar2 < 10) {
      cVar3 = bVar2 + 0x30;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar1 * 2] = cVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar1 * 2 + 1] = cVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string bytes_to_hex(const std::string &bytes) {
  std::string ret;
  ret.resize(bytes.size() * 2);
  auto nibble_to_hex = [](uint8_t nibble) -> char {
    nibble &= 0xF;
    if (nibble < 10)
      return '0' + nibble;
    return 'A' + (nibble - 10);
  };

  for (std::string::size_type i = 0; i < bytes.size(); i++) {
    uint8_t byte = bytes[i];
    ret[i * 2] = nibble_to_hex(byte >> 4);
    ret[i * 2 + 1] = nibble_to_hex(byte);
  }

  return ret;
}